

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O1

mraa_result_t mraa_pwm_enable(mraa_pwm_context dev,int enable)

{
  uint uVar1;
  mraa_adv_func_t *pmVar2;
  mraa_result_t mVar3;
  int __fd;
  int iVar4;
  ssize_t sVar5;
  int *piVar6;
  char *pcVar7;
  char out [2];
  char bu [64];
  char local_6a [2];
  char local_68 [64];
  
  if (dev == (mraa_pwm_context)0x0) {
    syslog(3,"pwm: enable: context is NULL");
    mVar3 = MRAA_ERROR_INVALID_HANDLE;
  }
  else {
    pmVar2 = dev->advance_func;
    if (pmVar2 != (mraa_adv_func_t *)0x0) {
      if (pmVar2->pwm_enable_replace != (_func_mraa_result_t_mraa_pwm_context_int *)0x0) {
        mVar3 = (*pmVar2->pwm_enable_replace)(dev,enable);
        return mVar3;
      }
      if (((pmVar2 != (mraa_adv_func_t *)0x0) &&
          (pmVar2->pwm_enable_pre != (_func_mraa_result_t_mraa_pwm_context_int *)0x0)) &&
         (mVar3 = (*pmVar2->pwm_enable_pre)(dev,enable), mVar3 != MRAA_SUCCESS)) {
        syslog(3,"mraa_pwm_enable (pwm%i): pwm_enable_pre failed, see syslog",(ulong)(uint)dev->pin)
        ;
        return MRAA_ERROR_UNSPECIFIED;
      }
    }
    mVar3 = MRAA_SUCCESS;
    snprintf(local_68,0x40,"/sys/class/pwm/pwmchip%d/pwm%d/enable",(ulong)(uint)dev->chipid,
             (ulong)(uint)dev->pin);
    __fd = open(local_68,2);
    if (__fd == -1) {
      uVar1 = dev->pin;
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      syslog(3,"pwm_enable: pwm%i: Failed to open enable for writing: %s",(ulong)uVar1,pcVar7);
      mVar3 = MRAA_ERROR_INVALID_RESOURCE;
    }
    else {
      iVar4 = snprintf(local_6a,2,"%d",enable);
      sVar5 = write(__fd,local_6a,(long)iVar4);
      if (sVar5 == -1) {
        uVar1 = dev->pin;
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        syslog(3,"pwm_enable: pwm%i: Failed to write to enable: %s",(ulong)uVar1,pcVar7);
        mVar3 = MRAA_ERROR_UNSPECIFIED;
      }
      close(__fd);
    }
  }
  return mVar3;
}

Assistant:

mraa_result_t
mraa_pwm_enable(mraa_pwm_context dev, int enable)
{
    if (!dev) {
        syslog(LOG_ERR, "pwm: enable: context is NULL");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (IS_FUNC_DEFINED(dev, pwm_enable_replace)) {
        return dev->advance_func->pwm_enable_replace(dev, enable);
    }

    if (IS_FUNC_DEFINED(dev, pwm_enable_pre)) {
        if (dev->advance_func->pwm_enable_pre(dev, enable) != MRAA_SUCCESS) {
            syslog(LOG_ERR, "mraa_pwm_enable (pwm%i): pwm_enable_pre failed, see syslog", dev->pin);
            return MRAA_ERROR_UNSPECIFIED;
        }
    }

    char bu[MAX_SIZE];
    snprintf(bu, MAX_SIZE, "/sys/class/pwm/pwmchip%d/pwm%d/enable", dev->chipid, dev->pin);

    int enable_f = open(bu, O_RDWR);

    if (enable_f == -1) {
        syslog(LOG_ERR, "pwm_enable: pwm%i: Failed to open enable for writing: %s", dev->pin, strerror(errno));
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    char out[2];
    int size = snprintf(out, sizeof(out), "%d", enable);
    if (write(enable_f, out, size * sizeof(char)) == -1) {
        syslog(LOG_ERR, "pwm_enable: pwm%i: Failed to write to enable: %s", dev->pin, strerror(errno));
        close(enable_f);
        return MRAA_ERROR_UNSPECIFIED;
    }
    close(enable_f);
    return MRAA_SUCCESS;
}